

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageLineSegments
          (SceneGraph *this,int hash,size_t numLineSegments,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fx *pVVar4;
  undefined8 uVar5;
  uint uVar6;
  HairSetNode *this_00;
  long lVar7;
  Vec3fx *pVVar8;
  undefined7 in_register_00000009;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_01;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  Ref<embree::SceneGraph::MaterialNode> local_48;
  undefined4 local_3c;
  Node *local_38;
  
  local_38 = (Node *)this;
  this_00 = (HairSetNode *)operator_new(0x118);
  local_48 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  local_3c = (undefined4)CONCAT71(in_register_00000009,mblur);
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE,&local_48,(BBox1f)0x3f80000000000000,
             (ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  this_01 = &this_00->hairs;
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(this_01,numLineSegments);
  uVar6 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
  uVar6 = (uVar6 * -0x194da000 | uVar6 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar6 = (uVar6 >> 0x10 ^ uVar6) * -0x7a143595;
  uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  if (numLineSegments != 0) {
    lVar7 = 0;
    sVar9 = numLineSegments;
    do {
      uVar16 = uVar6 * 0x19660d + 0x3c6ef35f;
      uVar11 = uVar6 * 0x17385ca9 + 0x47502932;
      uVar6 = uVar11;
      if ((uVar16 & 0x3e) != 0) {
        uVar11 = (uint)lVar7;
        uVar6 = uVar16;
      }
      (&((this_01->
         super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
         )._M_impl.super__Vector_impl_data._M_start)->vertex)[lVar7] = uVar11;
      (&((this_01->
         super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
         )._M_impl.super__Vector_impl_data._M_start)->id)[lVar7] = 0;
      lVar7 = lVar7 + 2;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = numLineSegments * 2;
  uVar10 = pvVar3->size_alloced;
  uVar17 = uVar10;
  if ((uVar10 < uVar13) && (uVar17 = uVar13, uVar18 = uVar10, uVar10 != 0)) {
    do {
      uVar17 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
      uVar18 = uVar17;
    } while (uVar17 < uVar13);
  }
  if (uVar13 < pvVar3->size_active) {
    pvVar3->size_active = uVar13;
  }
  if (uVar10 == uVar17) {
    pvVar3->size_active = uVar13;
  }
  else {
    pVVar4 = pvVar3->items;
    pVVar8 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
    pvVar3->items = pVVar8;
    if (pvVar3->size_active != 0) {
      lVar7 = 0;
      uVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar10 < pvVar3->size_active);
    }
    alignedFree(pVVar4);
    pvVar3->size_active = uVar13;
    pvVar3->size_alloced = uVar17;
  }
  if (uVar13 != 0) {
    lVar7 = 0;
    uVar10 = uVar13;
    do {
      iVar12 = uVar6 * 0x19660d;
      iVar14 = uVar6 * 0x17385ca9;
      iVar15 = uVar6 * -0x50b6f56b;
      uVar6 = uVar6 * 0x979e791 + 0xaaf95334;
      puVar1 = (undefined8 *)
               ((long)&((this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar7);
      *puVar1 = CONCAT44(iVar14 + 0x47502932,iVar12 + 0x3c6ef35f);
      puVar1[1] = CONCAT44(uVar6,iVar15 + -0x2e330917);
      lVar7 = lVar7 + 0x10;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  if ((char)local_3c != '\0') {
    pvVar3 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = pvVar3[1].size_alloced;
    uVar17 = uVar10;
    if ((uVar10 < uVar13) && (uVar17 = uVar13, uVar18 = uVar10, uVar10 != 0)) {
      do {
        uVar17 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
        uVar18 = uVar17;
      } while (uVar17 < uVar13);
    }
    if (uVar13 < pvVar3[1].size_active) {
      pvVar3[1].size_active = uVar13;
    }
    if (uVar10 == uVar17) {
      pvVar3[1].size_active = uVar13;
    }
    else {
      pVVar4 = pvVar3[1].items;
      pVVar8 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
      pvVar3[1].items = pVVar8;
      if (pvVar3[1].size_active != 0) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar7);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(pvVar3[1].items)->field_0 + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar10 < pvVar3[1].size_active);
      }
      alignedFree(pVVar4);
      pvVar3[1].size_active = uVar13;
      pvVar3[1].size_alloced = uVar17;
    }
    if (uVar13 != 0) {
      lVar7 = 0;
      do {
        iVar12 = uVar6 * 0x19660d;
        iVar14 = uVar6 * 0x17385ca9;
        iVar15 = uVar6 * -0x50b6f56b;
        uVar6 = uVar6 * 0x979e791 + 0xaaf95334;
        puVar1 = (undefined8 *)
                 ((long)&((this_00->positions).
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].items)->field_0 + lVar7);
        *puVar1 = CONCAT44(iVar14 + 0x47502932,iVar12 + 0x3c6ef35f);
        puVar1[1] = CONCAT44(uVar6,iVar15 + -0x2e330917);
        lVar7 = lVar7 + 0x10;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_38;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageLineSegments (int hash, size_t numLineSegments, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE,material,BBox1f(0,1),mblur?2:1);

    mesh->hairs.resize(numLineSegments);
    for (size_t i=0; i<numLineSegments; i++) {
      mesh->hairs[i].vertex = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(2*i);
      mesh->hairs[i].id = 0;
    }

    mesh->positions[0].resize(2*numLineSegments);
    for (size_t i=0; i<2*numLineSegments; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float r = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3ff(x,y,z,r);
    }

    if (mblur) 
    {
      mesh->positions[1].resize(2*numLineSegments);
      for (size_t i=0; i<2*numLineSegments; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float r = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3ff(x,y,z,r);
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }